

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int decode_client_hello(ptls_context_t *ctx,st_ptls_client_hello_t *ch,uint8_t *src,uint8_t *end,
                       ptls_handshake_properties_t *properties,ptls_t *tls_cbarg)

{
  byte *pbVar1;
  uint *puVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint8_t uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  byte bVar9;
  st_ptls_on_extension_t *psVar10;
  ulong uVar11;
  ushort uVar12;
  int iVar13;
  int iVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  byte *pbVar17;
  ptls_raw_extension_t *ppVar18;
  undefined1 *puVar19;
  ulong uVar20;
  byte *pbVar21;
  size_t *psVar22;
  undefined1 *puVar23;
  ushort *puVar24;
  ulong uVar25;
  long lVar26;
  undefined1 *puVar27;
  ptls_raw_extension_t *ppVar28;
  long lVar29;
  size_t sVar30;
  uint uVar31;
  ptls_raw_extension_t *ppVar32;
  ptls_raw_extension_t *end_00;
  ptls_iovec_t pVar33;
  st_ptls_extension_bitmap_t bitmap;
  ptls_raw_extension_t *local_a0;
  ptls_raw_extension_t *local_98;
  char local_89;
  ptls_raw_extension_t *local_88;
  ptls_t *local_80;
  ptls_raw_extension_t *local_78;
  size_t *local_70;
  ptls_raw_extension_t *local_68;
  anon_struct_264_2_e44304f5_for_alpn *local_60;
  ptls_iovec_t *local_58;
  st_ptls_signature_algorithms_t *local_50;
  anon_struct_168_2_32182ca3_for_identities *local_48;
  ptls_raw_extension_t *local_40;
  st_ptls_extension_bitmap_t local_38;
  
  if ((long)end - (long)src < 2) {
    return 0x32;
  }
  uVar12 = *(ushort *)src << 8 | *(ushort *)src >> 8;
  ch->legacy_version = uVar12;
  if (uVar12 < 0x301) {
    return 0x46;
  }
  if ((long)end - (long)(src + 2) < 0x20) {
    return 0x32;
  }
  ch->random_bytes = src + 2;
  if (src + 0x22 == end) {
    return 0x32;
  }
  puVar15 = src + 0x23;
  uVar20 = (ulong)src[0x22];
  if ((ulong)((long)end - (long)puVar15) < uVar20 || 0x20 < uVar20) {
    return 0x32;
  }
  (ch->legacy_session_id).base = puVar15;
  puVar15 = puVar15 + uVar20;
  (ch->legacy_session_id).len = uVar20;
  if ((ulong)((long)end - (long)puVar15) < 2) {
    return 0x32;
  }
  puVar16 = puVar15 + 2;
  uVar20 = (ulong)CONCAT11(*puVar15,puVar15[1]);
  if ((puVar15[1] & 1) != 0 || (ulong)((long)end - (long)puVar16) < uVar20) {
    return 0x32;
  }
  (ch->cipher_suites).base = puVar16;
  pbVar17 = puVar16 + uVar20;
  (ch->cipher_suites).len = uVar20;
  if (pbVar17 == end) {
    return 0x32;
  }
  uVar20 = (ulong)*pbVar17;
  pbVar17 = pbVar17 + 1;
  if ((ulong)((long)end - (long)pbVar17) < uVar20 || uVar20 == 0) {
    return 0x32;
  }
  (ch->compression_methods).ids = pbVar17;
  pbVar17 = pbVar17 + uVar20;
  (ch->compression_methods).count = uVar20;
  if (pbVar17 == end) {
    return 0;
  }
  ch->first_extension_at = (size_t)(pbVar17 + (2 - (long)src));
  local_38.bits = 0;
  if ((ulong)((long)end - (long)pbVar17) < 2) {
    return 0x32;
  }
  local_78 = (ptls_raw_extension_t *)(pbVar17 + 2);
  uVar20 = (ulong)CONCAT11(*pbVar17,pbVar17[1]);
  if ((ulong)((long)end - (long)local_78) < uVar20) {
    return 0x32;
  }
  if (uVar20 == 0) {
LAB_0012b4d9:
    if (local_78 == (ptls_raw_extension_t *)end) {
      return 0;
    }
    return 0x32;
  }
  local_48 = &(ch->psk).identities;
  local_50 = &ch->signature_algorithms;
  local_60 = &ch->alpn;
  local_58 = &ch->server_name;
  local_89 = properties != (ptls_handshake_properties_t *)0x0 && tls_cbarg != (ptls_t *)0x0;
  local_68 = ch->unknown_extensions;
  local_70 = &(ch->psk).identities.list[0].binder.len;
  end_00 = local_78;
  local_78 = (ptls_raw_extension_t *)(pbVar17 + uVar20 + 2);
LAB_0012aa17:
  if ((long)local_78 - (long)end_00 < 2) {
    return 0x32;
  }
  uVar12 = end_00->type << 8 | end_00->type >> 8;
  local_80 = (ptls_t *)(ulong)uVar12;
  local_a0 = end_00;
  iVar13 = extension_bitmap_testandset(&local_38,1,uVar12);
  if (iVar13 == 0) {
    return 0x2f;
  }
  if ((ulong)((long)local_78 - (long)&end_00->field_0x2) < 2) {
    return 0x32;
  }
  local_a0 = (ptls_raw_extension_t *)&end_00->field_0x4;
  uVar12 = CONCAT11(end_00->field_0x2,end_00->field_0x3);
  ppVar32 = (ptls_raw_extension_t *)(ulong)uVar12;
  iVar13 = (int)local_80;
  if ((ptls_raw_extension_t *)((long)local_78 - (long)local_a0) < ppVar32) {
    return 0x32;
  }
  puVar19 = &(ch->psk).field_0xb4;
  *puVar19 = *puVar19 & 0xfd;
  psVar10 = ctx->on_extension;
  ppVar18 = local_a0;
  local_98 = end_00;
  if (psVar10 != (st_ptls_on_extension_t *)0x0 && tls_cbarg != (ptls_t *)0x0) {
    pVar33.len._0_2_ = uVar12;
    pVar33.base = (uint8_t *)local_a0;
    pVar33.len._2_6_ = 0;
    local_88 = ppVar32;
    local_40 = local_a0;
    iVar14 = (*psVar10->cb)(psVar10,tls_cbarg,'\x01',(uint16_t)local_80,pVar33);
    iVar13 = (int)local_80;
    ppVar18 = local_40;
    ppVar32 = local_88;
    if (iVar14 != 0) {
      return 1;
    }
  }
  end_00 = (ptls_raw_extension_t *)(&local_98->field_0x4 + (long)ppVar32);
  uVar31 = (uint)ppVar32;
  if (iVar13 < 0x29) {
    if (0xc < iVar13) {
      if (iVar13 < 0x14) {
        if (iVar13 == 0xd) {
          iVar13 = decode_signature_algorithms(local_50,(uint8_t **)&local_a0,(uint8_t *)end_00);
          goto LAB_0012b29a;
        }
        if (iVar13 != 0x10) goto switchD_0012ab2c_caseD_2e;
        if (uVar31 < 2) {
          return 0x32;
        }
        puVar19 = (undefined1 *)
                  (ulong)(ushort)(*(ushort *)&local_98->field_0x4 << 8 |
                                 *(ushort *)&local_98->field_0x4 >> 8);
        ppVar18 = (ptls_raw_extension_t *)&local_98->field_0x6;
        if ((undefined1 *)((long)&ppVar32[-1].data.len + 6U) < puVar19) {
          return 0x32;
        }
        ppVar32 = (ptls_raw_extension_t *)(puVar19 + (long)local_98 + 6);
        do {
          if (ppVar32 == ppVar18) {
            return 0x32;
          }
          uVar20 = (ulong)(byte)ppVar18->type;
          pbVar17 = (byte *)((long)&ppVar18->type + 1);
          if ((ulong)((long)ppVar32 - (long)pbVar17) < uVar20) {
            return 0x32;
          }
          if (uVar20 == 0) {
            return 0x32;
          }
          uVar11 = (ch->alpn).count;
          if (uVar11 < 0x10) {
            (ch->alpn).count = uVar11 + 1;
            local_60->list[uVar11].base = pbVar17;
            local_60->list[uVar11].len = uVar20;
          }
          ppVar18 = (ptls_raw_extension_t *)(pbVar17 + uVar20);
        } while (ppVar18 != ppVar32);
      }
      else if (iVar13 == 0x14) {
        if (ppVar32 == (ptls_raw_extension_t *)0x0) {
          return 0x32;
        }
        puVar19 = &local_98->field_0x5;
        bVar9 = local_98->field_0x4;
        puVar23 = (undefined1 *)(ulong)bVar9;
        if ((undefined1 *)((long)&ppVar32[-1].data.len + 7U) < puVar23) {
          return 0x32;
        }
        if (puVar23 == (undefined1 *)0x1) {
          bVar9 = *puVar19;
        }
        if (bVar9 == 0) {
          return 0x32;
        }
        ppVar32 = (ptls_raw_extension_t *)(puVar19 + (long)puVar23);
        puVar27 = (undefined1 *)0x0;
        do {
          uVar20 = (ch->server_certificate_types).count;
          if (uVar20 < 8) {
            uVar6 = puVar19[(long)puVar27];
            (ch->server_certificate_types).count = uVar20 + 1;
            (ch->server_certificate_types).list[uVar20] = uVar6;
          }
          puVar27 = puVar27 + 1;
        } while (puVar23 != puVar27);
      }
      else {
        if (iVar13 != 0x1b) goto switchD_0012ab2c_caseD_2e;
        if (ppVar32 == (ptls_raw_extension_t *)0x0) {
          return 0x32;
        }
        puVar19 = &local_98->field_0x5;
        puVar23 = (undefined1 *)(ulong)(byte)local_98->field_0x4;
        if ((undefined1 *)((long)&ppVar32[-1].data.len + 7U) < puVar23) {
          return 0x32;
        }
        ppVar32 = (ptls_raw_extension_t *)(puVar19 + (long)puVar23);
        do {
          if ((long)puVar23 < 2) {
            return 0x32;
          }
          uVar7 = *puVar19;
          uVar8 = puVar19[1];
          puVar19 = puVar19 + 2;
          uVar20 = (ch->cert_compression_algos).count;
          if (uVar20 < 0x10) {
            (ch->cert_compression_algos).count = uVar20 + 1;
            (ch->cert_compression_algos).list[uVar20] = CONCAT11(uVar7,uVar8);
          }
          puVar23 = puVar23 + -2;
        } while ((ptls_raw_extension_t *)puVar19 != ppVar32);
      }
      goto joined_r0x0012b3d6;
    }
    if (iVar13 == 0) {
      local_88 = end_00;
      iVar13 = client_hello_decode_server_name(local_58,(uint8_t **)&local_a0,(uint8_t *)end_00);
      if (iVar13 != 0) {
        return iVar13;
      }
      end_00 = local_88;
      if (local_a0 != local_88) {
        return 0x32;
      }
    }
    else if (iVar13 == 5) {
      ch->field_0x228 = ch->field_0x228 | 1;
    }
    else {
      if (iVar13 != 10) goto switchD_0012ab2c_caseD_2e;
      (ch->negotiated_groups).base = (uint8_t *)ppVar18;
      (ch->negotiated_groups).len = (size_t)ppVar32;
    }
    goto LAB_0012b484;
  }
  switch(iVar13) {
  case 0x29:
    if (uVar31 < 2) {
      return 0x32;
    }
    pbVar17 = &local_98->field_0x6;
    puVar19 = (undefined1 *)(ulong)CONCAT11(local_98->field_0x4,local_98->field_0x5);
    if ((undefined1 *)((long)&ppVar32[-1].data.len + 6U) < puVar19) {
      return 0x32;
    }
    pbVar21 = puVar19 + (long)pbVar17;
    lVar26 = 0;
    do {
      lVar29 = lVar26;
      if ((ulong)((long)pbVar21 - (long)pbVar17) < 2) {
        return 0x32;
      }
      pbVar1 = pbVar17 + 2;
      if ((ulong)((long)pbVar21 - (long)pbVar1) <= ((ulong)*pbVar17 * 0x100 + (ulong)pbVar17[1]) - 1
         ) {
        return 0x32;
      }
      uVar20 = (ulong)*pbVar17 * 0x100 | (ulong)pbVar17[1];
      pbVar17 = pbVar1 + uVar20;
      if ((long)pbVar21 - (long)pbVar17 < 4) {
        return 0x32;
      }
      bVar9 = *pbVar17;
      bVar3 = pbVar17[1];
      bVar4 = pbVar17[2];
      bVar5 = pbVar17[3];
      pbVar17 = pbVar17 + 4;
      uVar11 = (ch->psk).identities.count;
      uVar25 = uVar11;
      if (uVar11 < 4) {
        uVar25 = uVar11 + 1;
        (ch->psk).identities.count = uVar25;
        local_48->list[uVar11].identity.base = pbVar1;
        local_48->list[uVar11].identity.len = uVar20;
        local_48->list[uVar11].obfuscated_ticket_age =
             (uint)bVar4 << 8 | (uint)bVar9 << 0x18 | (uint)bVar3 << 0x10 | (uint)bVar5;
        puVar19 = &local_48->list[uVar11].field_0x14;
        *(undefined8 *)puVar19 = 0;
        *(undefined8 *)(puVar19 + 8) = 0;
        *(undefined4 *)((long)&local_48->list[uVar11].binder.len + 4) = 0;
      }
      lVar26 = lVar29 + 1;
    } while (pbVar17 != pbVar21);
    (ch->psk).hash_end = pbVar21;
    if ((ulong)((long)end_00 - (long)pbVar21) < 2) {
      return 0x32;
    }
    uVar20 = (ulong)CONCAT11(*pbVar21,pbVar21[1]);
    if ((ulong)((long)end_00 - (long)(pbVar21 + 2)) < uVar20) {
      return 0x32;
    }
    if (uVar20 == 0) {
      return 0x32;
    }
    ppVar32 = (ptls_raw_extension_t *)(pbVar21 + 2 + uVar20);
    pbVar17 = pbVar21 + 3;
    sVar30 = (size_t)pbVar21[2];
    if ((ulong)((long)ppVar32 - (long)pbVar17) < sVar30) {
      return 0x32;
    }
    uVar20 = 0;
    psVar22 = local_70;
    while( true ) {
      if (uVar20 < uVar25) {
        ((ptls_iovec_t *)(psVar22 + -1))->base = pbVar17;
        *psVar22 = sVar30;
      }
      ppVar18 = (ptls_raw_extension_t *)(pbVar17 + sVar30);
      if (ppVar18 == ppVar32) break;
      uVar20 = uVar20 + 1;
      pbVar17 = (byte *)((long)&ppVar18->type + 1);
      sVar30 = (size_t)(byte)ppVar18->type;
      lVar29 = lVar29 + -1;
      psVar22 = psVar22 + 5;
      if ((ulong)((long)ppVar32 - (long)pbVar17) < sVar30) {
        return 0x32;
      }
    }
    if (lVar29 != 0) {
      return 0x2f;
    }
    if (ppVar32 != end_00) {
      return 0x32;
    }
    puVar19 = &(ch->psk).field_0xb4;
    *puVar19 = *puVar19 | 2;
    local_88 = end_00;
    break;
  case 0x2a:
    puVar19 = &(ch->psk).field_0xb4;
    *puVar19 = *puVar19 | 1;
    break;
  case 0x2b:
    if (ppVar32 == (ptls_raw_extension_t *)0x0) {
      return 0x32;
    }
    puVar24 = (ushort *)&local_98->field_0x5;
    bVar9 = local_98->field_0x4;
    if ((undefined1 *)((long)&ppVar32[-1].data.len + 7U) < (undefined1 *)(ulong)bVar9) {
      return 0x32;
    }
    if (bVar9 < 2) {
      return 0x32;
    }
    ppVar32 = (ptls_raw_extension_t *)((undefined1 *)(ulong)bVar9 + (long)puVar24);
    lVar26 = 1;
    do {
      if (lVar26 == 0) {
LAB_0012b262:
        lVar26 = 0;
      }
      else {
        lVar29 = lVar26;
        do {
          if ((ushort)(*puVar24 << 8 | *puVar24 >> 8) == 0x304) goto LAB_0012b262;
          lVar29 = lVar29 + -1;
        } while (lVar29 != 0);
      }
      puVar24 = puVar24 + 1;
      if ((ptls_raw_extension_t *)puVar24 == ppVar32) goto LAB_0012b36b;
      if ((long)ppVar32 - (long)puVar24 < 2) {
        return 0x32;
      }
    } while( true );
  case 0x2c:
    if (properties == (ptls_handshake_properties_t *)0x0) {
      return 0x2f;
    }
    if ((properties->field_0).server.cookie.key == (void *)0x0) {
      return 0x2f;
    }
    (ch->cookie).all.base = (uint8_t *)ppVar18;
    (ch->cookie).all.len = (size_t)ppVar32;
    if (ppVar32 < (ptls_raw_extension_t *)0x2) {
      return 0x32;
    }
    puVar19 = &local_98->field_0x6;
    puVar23 = (undefined1 *)(ulong)CONCAT11(local_98->field_0x4,local_98->field_0x5);
    if ((undefined1 *)((long)&ppVar32[-1].data.len + 6U) < puVar23) {
      return 0x32;
    }
    (ch->cookie).tbs.base = puVar19;
    if (puVar23 < (undefined1 *)0x2) {
      return 0x32;
    }
    ppVar18 = (ptls_raw_extension_t *)(puVar23 + (long)puVar19);
    uVar20 = (ulong)CONCAT11(local_98->field_0x6,local_98->field_0x7);
    if ((ulong)((long)ppVar18 - (long)&local_98->data) < uVar20) {
      return 0x32;
    }
    if (uVar20 == 0) {
      return 0x32;
    }
    ppVar32 = (ptls_raw_extension_t *)((long)&(local_98->data).base + uVar20);
    uVar20 = (ulong)*(byte *)&(local_98->data).base;
    puVar15 = (uint8_t *)((long)&(local_98->data).base + 1);
    if ((ulong)((long)ppVar32 - (long)puVar15) < uVar20) {
      return 0x32;
    }
    (ch->cookie).ch1_hash.base = puVar15;
    ppVar28 = (ptls_raw_extension_t *)(puVar15 + uVar20);
    (ch->cookie).ch1_hash.len = uVar20;
    if (ppVar28 == ppVar32) {
      return 0x32;
    }
    local_a0 = (ptls_raw_extension_t *)((long)&ppVar28->type + 1);
    bVar9 = (byte)ppVar28->type;
    if (bVar9 == 1) {
      puVar23 = &(ch->cookie).field_0x40;
      *puVar23 = *puVar23 | 1;
    }
    else {
      if (bVar9 != 0) {
        return 0x32;
      }
      if (((ch->cookie).field_0x40 & 1) != 0) {
        __assert_fail("!ch->cookie.sent_key_share",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                      ,0xec2,
                      "int decode_client_hello(ptls_context_t *, struct st_ptls_client_hello_t *, const uint8_t *, const uint8_t *const, ptls_handshake_properties_t *, ptls_t *)"
                     );
      }
    }
    if (local_a0 != ppVar32) {
      return 0x32;
    }
    (ch->cookie).tbs.len = (long)ppVar32 - (long)puVar19;
    if (ppVar18 == ppVar32) {
      return 0x32;
    }
    puVar19 = &ppVar28->field_0x2;
    uVar20 = (ulong)*(byte *)((long)&ppVar28->type + 1);
    if ((ulong)((long)ppVar18 - (long)puVar19) < uVar20) {
      return 0x32;
    }
    (ch->cookie).signature.base = puVar19;
    ppVar32 = (ptls_raw_extension_t *)(puVar19 + uVar20);
    (ch->cookie).signature.len = uVar20;
    if (ppVar32 != ppVar18) {
      return 0x32;
    }
    goto joined_r0x0012b3d6;
  case 0x2d:
    if (ppVar32 == (ptls_raw_extension_t *)0x0) {
      return 0x32;
    }
    puVar19 = (undefined1 *)(ulong)(byte)local_98->field_0x4;
    if ((undefined1 *)((long)&ppVar32[-1].data.len + 7U) < puVar19) {
      return 0x32;
    }
    ppVar32 = (ptls_raw_extension_t *)(&local_98->field_0x5 + (long)puVar19);
    ppVar18 = (ptls_raw_extension_t *)&local_98->field_0x5;
    do {
      if (puVar19 == (undefined1 *)0x0) {
        return 0x32;
      }
      ppVar28 = (ptls_raw_extension_t *)((long)&ppVar18->type + 1);
      bVar9 = (byte)ppVar18->type;
      if (bVar9 < 0x20) {
        puVar2 = &(ch->psk).ke_modes;
        *puVar2 = *puVar2 | 1 << (bVar9 & 0x1f);
      }
      puVar19 = puVar19 + -1;
      ppVar18 = ppVar28;
    } while (ppVar28 != ppVar32);
    goto joined_r0x0012b3d6;
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
switchD_0012ab2c_caseD_2e:
    if (((local_89 != '\0') &&
        (properties->collect_extension !=
         (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0)) &&
       (ppVar32 = ppVar18, local_88 = end_00,
       iVar13 = (*properties->collect_extension)(tls_cbarg,properties,(uint16_t)iVar13),
       end_00 = local_88, iVar13 != 0)) {
      iVar13 = collect_unknown_extension
                         (local_80,(uint16_t)ppVar18,(uint8_t *)local_88,(uint8_t *)local_68,ppVar32
                         );
      end_00 = local_88;
LAB_0012b29a:
      if (iVar13 != 0) {
        return iVar13;
      }
    }
    break;
  case 0x33:
    (ch->key_shares).base = (uint8_t *)ppVar18;
    (ch->key_shares).len = (size_t)ppVar32;
    break;
  default:
    if (iVar13 == 0x3a) {
      if (uVar31 != 2) {
        return 0x32;
      }
      (ch->ticket_request).new_session_count = local_98->field_0x4;
      (ch->ticket_request).resumption_count = local_98->field_0x5;
    }
    else {
      if (iVar13 != 0xfe0d) goto switchD_0012ab2c_caseD_2e;
      if (ppVar32 == (ptls_raw_extension_t *)0x0) {
        return 0x32;
      }
      uVar6 = local_98->field_0x4;
      (ch->ech).type = uVar6;
      if (uVar6 == '\x01') {
        if (uVar31 != 1) {
          return 0x32;
        }
        pbVar17 = (byte *)0x13d5ad;
        uVar20 = 0;
      }
      else {
        if (uVar6 != '\0') {
          return 0x2f;
        }
        if (uVar31 < 3) {
          return 0x32;
        }
        (ch->ech).cipher_suite.kdf =
             *(ushort *)&local_98->field_0x5 << 8 | *(ushort *)&local_98->field_0x5 >> 8;
        if (uVar31 < 5) {
          return 0x32;
        }
        (ch->ech).cipher_suite.aead =
             *(ushort *)&local_98->field_0x7 << 8 | *(ushort *)&local_98->field_0x7 >> 8;
        if (uVar31 == 5) {
          return 0x32;
        }
        (ch->ech).config_id = *(uint8_t *)((long)&(local_98->data).base + 1);
        if ((uVar31 & 0xfffffffe) == 6) {
          return 0x32;
        }
        uVar12 = *(ushort *)((long)&(local_98->data).base + 2);
        puVar19 = (undefined1 *)(ulong)(ushort)(uVar12 << 8 | uVar12 >> 8);
        if (&ppVar32[-1].data.len < puVar19) {
          return 0x32;
        }
        pbVar21 = (byte *)((long)&local_98->type + (long)puVar19);
        (ch->ech).enc.base = (uint8_t *)((long)&(local_98->data).base + 4);
        (ch->ech).enc.len = (size_t)puVar19;
        if ((ulong)((long)end_00 - (long)(pbVar21 + 0xc)) < 2) {
          return 0x32;
        }
        uVar20 = (ulong)pbVar21[0xc] * 0x100;
        pbVar17 = pbVar21 + 0xe;
        if ((ulong)((long)end_00 - (long)pbVar17) <= (uVar20 + pbVar21[0xd]) - 1) {
          return 0x32;
        }
        uVar20 = uVar20 | pbVar21[0xd];
      }
      (ch->ech).payload.base = pbVar17;
      (ch->ech).payload.len = uVar20;
    }
  }
  goto LAB_0012b484;
LAB_0012b36b:
  if (lVar26 != 1) {
    ch->selected_version = 0x304;
  }
joined_r0x0012b3d6:
  if (ppVar32 != end_00) {
    return 0x32;
  }
LAB_0012b484:
  if (end_00 == local_78) goto LAB_0012b4d9;
  goto LAB_0012aa17;
}

Assistant:

static int decode_client_hello(ptls_context_t *ctx, struct st_ptls_client_hello_t *ch, const uint8_t *src, const uint8_t *const end,
                               ptls_handshake_properties_t *properties, ptls_t *tls_cbarg)
{
    const uint8_t *start = src;
    uint16_t exttype = 0;
    int ret;

    /* decode protocol version (do not bare to decode something older than TLS 1.0) */
    if ((ret = ptls_decode16(&ch->legacy_version, &src, end)) != 0)
        goto Exit;
    if (ch->legacy_version < 0x0301) {
        ret = PTLS_ALERT_PROTOCOL_VERSION;
        goto Exit;
    }

    /* skip random */
    if (end - src < PTLS_HELLO_RANDOM_SIZE) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    ch->random_bytes = src;
    src += PTLS_HELLO_RANDOM_SIZE;

    /* skip legacy_session_id */
    ptls_decode_open_block(src, end, 1, {
        if (end - src > 32) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        ch->legacy_session_id = ptls_iovec_init(src, end - src);
        src = end;
    });

    /* decode and select from ciphersuites */
    ptls_decode_open_block(src, end, 2, {
        if ((end - src) % 2 != 0) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        ch->cipher_suites = ptls_iovec_init(src, end - src);
        src = end;
    });

    /* decode legacy_compression_methods */
    ptls_decode_open_block(src, end, 1, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        ch->compression_methods.ids = src;
        ch->compression_methods.count = end - src;
        src = end;
    });

    /* In TLS versions 1.2 and earlier CH might not have an extensions block (or they might, see what OpenSSL 1.0.0 sends); so bail
     * out if that is the case after parsing the main variables. Zero is returned as it is a valid ClientHello. However
     * `ptls_t::selected_version` remains zero indicating that no compatible version were found. */
    if (src == end) {
        ret = 0;
        goto Exit;
    }

    /* decode extensions */
    ch->first_extension_at = src - start + 2;
    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, &exttype, {
        ch->psk.is_last_extension = 0;
        if (ctx->on_extension != NULL && tls_cbarg != NULL &&
            (ret = ctx->on_extension->cb(ctx->on_extension, tls_cbarg, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, exttype,
                                         ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_SERVER_NAME:
            if ((ret = client_hello_decode_server_name(&ch->server_name, &src, end)) != 0)
                goto Exit;
            if (src != end) {
                ret = PTLS_ALERT_DECODE_ERROR;
                goto Exit;
            }
            break;
        case PTLS_EXTENSION_TYPE_ALPN:
            ptls_decode_block(src, end, 2, {
                do {
                    ptls_decode_open_block(src, end, 1, {
                        /* rfc7301 3.1: empty strings MUST NOT be included */
                        if (src == end) {
                            ret = PTLS_ALERT_DECODE_ERROR;
                            goto Exit;
                        }
                        if (ch->alpn.count < PTLS_ELEMENTSOF(ch->alpn.list))
                            ch->alpn.list[ch->alpn.count++] = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                } while (src != end);
            });
            break;
        case PTLS_EXTENSION_TYPE_SERVER_CERTIFICATE_TYPE:
            ptls_decode_block(src, end, 1, {
                size_t list_size = end - src;

                /* RFC7250 4.1: No empty list, no list with single x509 element */
                if (list_size == 0 || (list_size == 1 && *src == PTLS_CERTIFICATE_TYPE_X509)) {
                    ret = PTLS_ALERT_DECODE_ERROR;
                    goto Exit;
                }

                do {
                    if (ch->server_certificate_types.count < PTLS_ELEMENTSOF(ch->server_certificate_types.list))
                        ch->server_certificate_types.list[ch->server_certificate_types.count++] = *src;
                    src++;
                } while (src != end);
            });
            break;
        case PTLS_EXTENSION_TYPE_COMPRESS_CERTIFICATE:
            ptls_decode_block(src, end, 1, {
                do {
                    uint16_t id;
                    if ((ret = ptls_decode16(&id, &src, end)) != 0)
                        goto Exit;
                    if (ch->cert_compression_algos.count < PTLS_ELEMENTSOF(ch->cert_compression_algos.list))
                        ch->cert_compression_algos.list[ch->cert_compression_algos.count++] = id;
                } while (src != end);
            });
            break;
        case PTLS_EXTENSION_TYPE_SUPPORTED_GROUPS:
            ch->negotiated_groups = ptls_iovec_init(src, end - src);
            break;
        case PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS:
            if ((ret = decode_signature_algorithms(&ch->signature_algorithms, &src, end)) != 0)
                goto Exit;
            break;
        case PTLS_EXTENSION_TYPE_KEY_SHARE:
            ch->key_shares = ptls_iovec_init(src, end - src);
            break;
        case PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS:
            ptls_decode_block(src, end, 1, {
                size_t selected_index = PTLS_ELEMENTSOF(supported_versions);
                do {
                    size_t i;
                    uint16_t v;
                    if ((ret = ptls_decode16(&v, &src, end)) != 0)
                        goto Exit;
                    for (i = 0; i != selected_index; ++i) {
                        if (supported_versions[i] == v) {
                            selected_index = i;
                            break;
                        }
                    }
                } while (src != end);
                if (selected_index != PTLS_ELEMENTSOF(supported_versions))
                    ch->selected_version = supported_versions[selected_index];
            });
            break;
        case PTLS_EXTENSION_TYPE_COOKIE:
            if (properties == NULL || properties->server.cookie.key == NULL) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            ch->cookie.all = ptls_iovec_init(src, end - src);
            ptls_decode_block(src, end, 2, {
                ch->cookie.tbs.base = (void *)src;
                ptls_decode_open_block(src, end, 2, {
                    ptls_decode_open_block(src, end, 1, {
                        ch->cookie.ch1_hash = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                    uint8_t sent_key_share;
                    if ((ret = ptls_decode8(&sent_key_share, &src, end)) != 0)
                        goto Exit;
                    switch (sent_key_share) {
                    case 0:
                        assert(!ch->cookie.sent_key_share);
                        break;
                    case 1:
                        ch->cookie.sent_key_share = 1;
                        break;
                    default:
                        ret = PTLS_ALERT_DECODE_ERROR;
                        goto Exit;
                    }
                });
                ch->cookie.tbs.len = src - ch->cookie.tbs.base;
                ptls_decode_block(src, end, 1, {
                    ch->cookie.signature = ptls_iovec_init(src, end - src);
                    src = end;
                });
            });
            break;
        case PTLS_EXTENSION_TYPE_PRE_SHARED_KEY: {
            size_t num_identities = 0;
            ptls_decode_open_block(src, end, 2, {
                do {
                    ptls_client_hello_psk_identity_t psk = {{NULL}};
                    ptls_decode_open_block(src, end, 2, {
                        if (end - src < 1) {
                            ret = PTLS_ALERT_DECODE_ERROR;
                            goto Exit;
                        }
                        psk.identity = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                    if ((ret = ptls_decode32(&psk.obfuscated_ticket_age, &src, end)) != 0)
                        goto Exit;
                    if (ch->psk.identities.count < PTLS_ELEMENTSOF(ch->psk.identities.list))
                        ch->psk.identities.list[ch->psk.identities.count++] = psk;
                    ++num_identities;
                } while (src != end);
            });
            ch->psk.hash_end = src;
            ptls_decode_block(src, end, 2, {
                size_t num_binders = 0;
                do {
                    ptls_decode_open_block(src, end, 1, {
                        if (num_binders < ch->psk.identities.count)
                            ch->psk.identities.list[num_binders].binder = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                    ++num_binders;
                } while (src != end);
                if (num_identities != num_binders) {
                    ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                    goto Exit;
                }
            });
            ch->psk.is_last_extension = 1;
        } break;
        case PTLS_EXTENSION_TYPE_PSK_KEY_EXCHANGE_MODES:
            ptls_decode_block(src, end, 1, {
                do {
                    uint8_t mode;
                    if ((ret = ptls_decode8(&mode, &src, end)) != 0)
                        goto Exit;
                    if (mode < sizeof(ch->psk.ke_modes) * 8)
                        ch->psk.ke_modes |= 1u << mode;
                } while (src != end);
            });
            break;
        case PTLS_EXTENSION_TYPE_EARLY_DATA:
            ch->psk.early_data_indication = 1;
            break;
        case PTLS_EXTENSION_TYPE_STATUS_REQUEST:
            ch->status_request = 1;
            break;
        case PTLS_EXTENSION_TYPE_TICKET_REQUEST:
            if (end - src != 2) {
                ret = PTLS_ALERT_DECODE_ERROR;
                goto Exit;
            }
            ch->ticket_request.new_session_count = *src++;
            ch->ticket_request.resumption_count = *src++;
            break;
        case PTLS_EXTENSION_TYPE_ENCRYPTED_CLIENT_HELLO:
            if ((ret = ptls_decode8(&ch->ech.type, &src, end)) != 0)
                goto Exit;
            switch (ch->ech.type) {
            case PTLS_ECH_CLIENT_HELLO_TYPE_OUTER:
                if ((ret = ptls_decode16(&ch->ech.cipher_suite.kdf, &src, end)) != 0 ||
                    (ret = ptls_decode16(&ch->ech.cipher_suite.aead, &src, end)) != 0)
                    goto Exit;
                if ((ret = ptls_decode8(&ch->ech.config_id, &src, end)) != 0)
                    goto Exit;
                ptls_decode_open_block(src, end, 2, {
                    ch->ech.enc = ptls_iovec_init(src, end - src);
                    src = end;
                });
                ptls_decode_open_block(src, end, 2, {
                    if (src == end) {
                        ret = PTLS_ALERT_DECODE_ERROR;
                        goto Exit;
                    }
                    ch->ech.payload = ptls_iovec_init(src, end - src);
                    src = end;
                });
                break;
            case PTLS_ECH_CLIENT_HELLO_TYPE_INNER:
                if (src != end) {
                    ret = PTLS_ALERT_DECODE_ERROR;
                    goto Exit;
                }
                ch->ech.payload = ptls_iovec_init("", 0); /* non-zero base indicates that the extension was received */
                break;
            default:
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            src = end;
            break;
        default:
            if (tls_cbarg != NULL && should_collect_unknown_extension(tls_cbarg, properties, exttype)) {
                if ((ret = collect_unknown_extension(tls_cbarg, exttype, src, end, ch->unknown_extensions)) != 0)
                    goto Exit;
            }
            break;
        }
        src = end;
    });

    ret = 0;
Exit:
    return ret;
}